

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mlneuron.cxx
# Opt level: O1

string * __thiscall
MlCalciumChannel::getParameter(string *__return_storage_ptr__,MlCalciumChannel *this,string *name)

{
  stringstream param;
  stringstream local_190 [128];
  ios_base local_110 [264];
  
  std::__cxx11::stringstream::stringstream(local_190);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_190);
  std::ios_base::~ios_base(local_110);
  return __return_storage_ptr__;
}

Assistant:

string MlCalciumChannel::getParameter(const string& name) const
{
	stringstream param;
/*	
	if (name=="reversal-potential") 
		param << dReversal;
	else if (name=="weight")
		param << dWeight;
	else
		param << StochasticFunction::getParameter(name);
*/		
	return param.str();
}